

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_ARRAY::GarbageCollector
          (_Type_ARRAY *this,Variable *object,offset_in_Memory_to_subr caller)

{
  Object *pOVar1;
  ulong uVar2;
  offset_in_Memory_to_subr in_RCX;
  long *plVar3;
  Array *local_b8;
  undefined1 local_90 [28];
  uint sz_1;
  uint i_1;
  Array *local_68;
  Memory *local_60;
  undefined1 local_58 [24];
  uint sz;
  uint i;
  Array *obj;
  offset_in_Memory_to_subr caller_local;
  Memory *local_28;
  Variable *object_local;
  _Type_ARRAY *this_local;
  
  obj = (Array *)caller;
  caller_local = in_RCX;
  local_28 = (Memory *)object;
  object_local = (Variable *)this;
  this_local = (_Type_ARRAY *)caller;
  pOVar1 = Variable::operator->(object);
  plVar3 = (long *)((long)(pOVar1->memory->arr)._M_elems + caller_local);
  if (((ulong)obj & 1) == 0) {
    local_b8 = obj;
  }
  else {
    local_b8 = *(Array **)((long)obj + *plVar3 + -1);
  }
  pOVar1 = Variable::operator->((Variable *)local_28);
  uVar2 = (*(code *)local_b8)(plVar3,pOVar1->ID);
  if ((uVar2 & 1) == 0) {
    pOVar1 = Variable::operator->((Variable *)local_28);
    _sz = Object::GetData<LiteScript::Array>(pOVar1);
    local_58._20_4_ = 0;
    local_58._16_4_ = Array::UnamedCount(_sz);
    for (; (uint)local_58._20_4_ < (uint)local_58._16_4_; local_58._20_4_ = local_58._20_4_ + 1) {
      Array::ConstantGet((Array *)local_58,(uint)_sz);
      local_60 = (Memory *)caller_local;
      local_68 = obj;
      Variable::GarbageCollector((Variable *)local_58,(offset_in_Memory_to_subr)obj);
      Variable::~Variable((Variable *)local_58);
    }
    local_90._24_4_ = 0;
    local_90._20_4_ = Array::NamedCount(_sz);
    for (; (uint)local_90._24_4_ < (uint)local_90._20_4_; local_90._24_4_ = local_90._24_4_ + 1) {
      Array::GetNamedVariable((Array *)local_90,(uint)_sz);
      Variable::GarbageCollector((Variable *)local_90,(offset_in_Memory_to_subr)obj);
      Variable::~Variable((Variable *)local_90);
    }
  }
  return;
}

Assistant:

void LiteScript::_Type_ARRAY::GarbageCollector(const Variable &object, bool (Memory::*caller)(unsigned int)) const {
    if ((object->memory.*caller)(object->ID))
        return;
    const Array& obj = object->GetData<Array>();
    for (unsigned int i = 0, sz = obj.UnamedCount(); i < sz; i++)
        obj.ConstantGet(i).GarbageCollector(caller);
    for (unsigned int i = 0, sz = obj.NamedCount(); i < sz; i++)
        obj.GetNamedVariable(i).GarbageCollector(caller);
}